

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

void __thiscall
QMakeSourceFileInfo::addSourceFiles
          (QMakeSourceFileInfo *this,ProStringList *l,uchar seek,SourceFileType type)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((l->super_QList<ProString>).d.size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      ProString::toQString
                (&local_50,
                 (ProString *)((long)&(((l->super_QList<ProString>).d.ptr)->m_string).d.d + lVar2));
      addSourceFile(this,&local_50,seek,type);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x30;
    } while (uVar1 < (ulong)(l->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::addSourceFiles(const ProStringList &l, uchar seek,
                                         QMakeSourceFileInfo::SourceFileType type)
{
    for(int i=0; i<l.size(); ++i)
        addSourceFile(l.at(i).toQString(), seek, type);
}